

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V1LayerParameter::Clear(V1LayerParameter *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *pLVar2;
  LogFinisher local_87a;
  byte local_879;
  LogMessage local_878;
  LogFinisher local_83a;
  byte local_839;
  LogMessage local_838;
  LogFinisher local_7fa;
  byte local_7f9;
  LogMessage local_7f8;
  LogFinisher local_7ba;
  byte local_7b9;
  LogMessage local_7b8;
  LogFinisher local_77a;
  byte local_779;
  LogMessage local_778;
  LogFinisher local_73a;
  byte local_739;
  LogMessage local_738;
  LogFinisher local_6fa;
  byte local_6f9;
  LogMessage local_6f8;
  LogFinisher local_6ba;
  byte local_6b9;
  LogMessage local_6b8;
  LogFinisher local_67a;
  byte local_679;
  LogMessage local_678;
  LogFinisher local_63a;
  byte local_639;
  LogMessage local_638;
  LogFinisher local_5fa;
  byte local_5f9;
  LogMessage local_5f8;
  LogFinisher local_5ba;
  byte local_5b9;
  LogMessage local_5b8;
  LogFinisher local_57a;
  byte local_579;
  LogMessage local_578;
  LogFinisher local_53a;
  byte local_539;
  LogMessage local_538;
  LogFinisher local_4fa;
  byte local_4f9;
  LogMessage local_4f8;
  LogFinisher local_4ba;
  byte local_4b9;
  LogMessage local_4b8;
  LogFinisher local_47a;
  byte local_479;
  LogMessage local_478;
  LogFinisher local_43a;
  byte local_439;
  LogMessage local_438;
  LogFinisher local_3fa;
  byte local_3f9;
  LogMessage local_3f8;
  LogFinisher local_3ba;
  byte local_3b9;
  LogMessage local_3b8;
  LogFinisher local_37a;
  byte local_379;
  LogMessage local_378;
  LogFinisher local_33a;
  byte local_339;
  LogMessage local_338;
  LogFinisher local_2fa;
  byte local_2f9;
  LogMessage local_2f8;
  LogFinisher local_2ba;
  byte local_2b9;
  LogMessage local_2b8;
  LogFinisher local_27a;
  byte local_279;
  LogMessage local_278;
  LogFinisher local_23a;
  byte local_239;
  LogMessage local_238;
  LogFinisher local_1fa;
  byte local_1f9;
  LogMessage local_1f8;
  LogFinisher local_1ba;
  byte local_1b9;
  LogMessage local_1b8;
  LogFinisher local_17a;
  byte local_179;
  LogMessage local_178;
  LogFinisher local_13a;
  byte local_139;
  LogMessage local_138;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_bd [20];
  byte local_a9;
  LogMessage local_a8;
  V1LayerParameter *local_70;
  V1LayerParameter *this_local;
  InternalMetadataWithArena *local_60;
  undefined4 local_54;
  HasBits<2UL> *local_50;
  undefined4 local_44;
  HasBits<2UL> *local_40;
  undefined4 local_34;
  HasBits<2UL> *local_30;
  undefined4 local_24;
  HasBits<2UL> *local_20;
  HasBits<2UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_70 = this;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->top_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::Clear(&this->blobs_);
  google::protobuf::RepeatedField<float>::Clear(&this->blobs_lr_);
  google::protobuf::RepeatedField<float>::Clear(&this->weight_decay_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::Clear(&this->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::Clear(&this->exclude_);
  google::protobuf::RepeatedField<float>::Clear(&this->loss_weight_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->param_);
  google::protobuf::RepeatedField<int>::Clear(&this->blob_share_mode_);
  local_20 = &this->_has_bits_;
  local_24 = 0;
  if ((local_20->has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->name_,default_value);
      local_a9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f55);
        local_a9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a8,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_bd,pLVar2);
      }
      if ((local_a9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_layer(this);
    if (bVar1) {
      local_f9 = 0;
      if (this->layer_ == (V0LayerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f59);
        local_f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_f8,"CHECK failed: layer_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_fa,pLVar2);
      }
      if ((local_f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_f8);
      }
      V0LayerParameter::Clear(this->layer_);
    }
    bVar1 = has_concat_param(this);
    if (bVar1) {
      local_139 = 0;
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f5d);
        local_139 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_138,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar2);
      }
      if ((local_139 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_138);
      }
      ConcatParameter::Clear(this->concat_param_);
    }
    bVar1 = has_convolution_param(this);
    if (bVar1) {
      local_179 = 0;
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_178,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f61);
        local_179 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_178,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_17a,pLVar2);
      }
      if ((local_179 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_178);
      }
      ConvolutionParameter::Clear(this->convolution_param_);
    }
    bVar1 = has_data_param(this);
    if (bVar1) {
      local_1b9 = 0;
      if (this->data_param_ == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f65);
        local_1b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1b8,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_1ba,pLVar2);
      }
      if ((local_1b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
      }
      DataParameter::Clear(this->data_param_);
    }
    bVar1 = has_dropout_param(this);
    if (bVar1) {
      local_1f9 = 0;
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f69);
        local_1f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1f8,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_1fa,pLVar2);
      }
      if ((local_1f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f8);
      }
      DropoutParameter::Clear(this->dropout_param_);
    }
    bVar1 = has_hdf5_data_param(this);
    if (bVar1) {
      local_239 = 0;
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_238,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f6d);
        local_239 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_238,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_23a,pLVar2);
      }
      if ((local_239 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_238);
      }
      HDF5DataParameter::Clear(this->hdf5_data_param_);
    }
    bVar1 = has_hdf5_output_param(this);
    if (bVar1) {
      local_279 = 0;
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_278,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f71);
        local_279 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_278,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_27a,pLVar2);
      }
      if ((local_279 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_278);
      }
      HDF5OutputParameter::Clear(this->hdf5_output_param_);
    }
  }
  local_30 = &this->_has_bits_;
  local_34 = 0;
  if ((local_30->has_bits_[0] & 0xff00) != 0) {
    bVar1 = has_image_data_param(this);
    if (bVar1) {
      local_2b9 = 0;
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f77);
        local_2b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_2b8,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_2ba,pLVar2);
      }
      if ((local_2b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_2b8);
      }
      ImageDataParameter::Clear(this->image_data_param_);
    }
    bVar1 = has_infogain_loss_param(this);
    if (bVar1) {
      local_2f9 = 0;
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7b);
        local_2f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_2f8,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_2fa,pLVar2);
      }
      if ((local_2f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_2f8);
      }
      InfogainLossParameter::Clear(this->infogain_loss_param_);
    }
    bVar1 = has_inner_product_param(this);
    if (bVar1) {
      local_339 = 0;
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_338,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7f);
        local_339 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_338,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_33a,pLVar2);
      }
      if ((local_339 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_338);
      }
      InnerProductParameter::Clear(this->inner_product_param_);
    }
    bVar1 = has_lrn_param(this);
    if (bVar1) {
      local_379 = 0;
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_378,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f83);
        local_379 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_378,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_37a,pLVar2);
      }
      if ((local_379 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_378);
      }
      LRNParameter::Clear(this->lrn_param_);
    }
    bVar1 = has_pooling_param(this);
    if (bVar1) {
      local_3b9 = 0;
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f87);
        local_3b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_3b8,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_3ba,pLVar2);
      }
      if ((local_3b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_3b8);
      }
      PoolingParameter::Clear(this->pooling_param_);
    }
    bVar1 = has_window_data_param(this);
    if (bVar1) {
      local_3f9 = 0;
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8b);
        local_3f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_3f8,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_3fa,pLVar2);
      }
      if ((local_3f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_3f8);
      }
      WindowDataParameter::Clear(this->window_data_param_);
    }
    bVar1 = has_power_param(this);
    if (bVar1) {
      local_439 = 0;
      if (this->power_param_ == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_438,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8f);
        local_439 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_438,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_43a,pLVar2);
      }
      if ((local_439 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_438);
      }
      PowerParameter::Clear(this->power_param_);
    }
    bVar1 = has_memory_data_param(this);
    if (bVar1) {
      local_479 = 0;
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_478,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f93);
        local_479 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_478,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_47a,pLVar2);
      }
      if ((local_479 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_478);
      }
      MemoryDataParameter::Clear(this->memory_data_param_);
    }
  }
  local_40 = &this->_has_bits_;
  local_44 = 0;
  if ((local_40->has_bits_[0] & 0xff0000) != 0) {
    bVar1 = has_argmax_param(this);
    if (bVar1) {
      local_4b9 = 0;
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f99);
        local_4b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_4b8,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_4ba,pLVar2);
      }
      if ((local_4b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_4b8);
      }
      ArgMaxParameter::Clear(this->argmax_param_);
    }
    bVar1 = has_eltwise_param(this);
    if (bVar1) {
      local_4f9 = 0;
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f9d);
        local_4f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_4f8,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_4fa,pLVar2);
      }
      if ((local_4f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_4f8);
      }
      EltwiseParameter::Clear(this->eltwise_param_);
    }
    bVar1 = has_threshold_param(this);
    if (bVar1) {
      local_539 = 0;
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_538,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa1);
        local_539 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_538,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_53a,pLVar2);
      }
      if ((local_539 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_538);
      }
      ThresholdParameter::Clear(this->threshold_param_);
    }
    bVar1 = has_dummy_data_param(this);
    if (bVar1) {
      local_579 = 0;
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_578,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa5);
        local_579 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_578,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_57a,pLVar2);
      }
      if ((local_579 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_578);
      }
      DummyDataParameter::Clear(this->dummy_data_param_);
    }
    bVar1 = has_accuracy_param(this);
    if (bVar1) {
      local_5b9 = 0;
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_5b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa9);
        local_5b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_5b8,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_5ba,pLVar2);
      }
      if ((local_5b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_5b8);
      }
      AccuracyParameter::Clear(this->accuracy_param_);
    }
    bVar1 = has_hinge_loss_param(this);
    if (bVar1) {
      local_5f9 = 0;
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_5f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fad);
        local_5f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_5f8,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_5fa,pLVar2);
      }
      if ((local_5f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_5f8);
      }
      HingeLossParameter::Clear(this->hinge_loss_param_);
    }
    bVar1 = has_relu_param(this);
    if (bVar1) {
      local_639 = 0;
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_638,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb1);
        local_639 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_638,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_63a,pLVar2);
      }
      if ((local_639 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_638);
      }
      ReLUParameter::Clear(this->relu_param_);
    }
    bVar1 = has_slice_param(this);
    if (bVar1) {
      local_679 = 0;
      if (this->slice_param_ == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_678,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb5);
        local_679 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_678,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_67a,pLVar2);
      }
      if ((local_679 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_678);
      }
      SliceParameter::Clear(this->slice_param_);
    }
  }
  local_50 = &this->_has_bits_;
  local_54 = 0;
  if ((local_50->has_bits_[0] & 0xff000000) != 0) {
    bVar1 = has_mvn_param(this);
    if (bVar1) {
      local_6b9 = 0;
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbb);
        local_6b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_6b8,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_6ba,pLVar2);
      }
      if ((local_6b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_6b8);
      }
      MVNParameter::Clear(this->mvn_param_);
    }
    bVar1 = has_transform_param(this);
    if (bVar1) {
      local_6f9 = 0;
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbf);
        local_6f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_6f8,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_6fa,pLVar2);
      }
      if ((local_6f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_6f8);
      }
      TransformationParameter::Clear(this->transform_param_);
    }
    bVar1 = has_tanh_param(this);
    if (bVar1) {
      local_739 = 0;
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_738,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc3);
        local_739 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_738,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_73a,pLVar2);
      }
      if ((local_739 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_738);
      }
      TanHParameter::Clear(this->tanh_param_);
    }
    bVar1 = has_sigmoid_param(this);
    if (bVar1) {
      local_779 = 0;
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_778,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc7);
        local_779 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_778,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_77a,pLVar2);
      }
      if ((local_779 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_778);
      }
      SigmoidParameter::Clear(this->sigmoid_param_);
    }
    bVar1 = has_softmax_param(this);
    if (bVar1) {
      local_7b9 = 0;
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_7b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcb);
        local_7b9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_7b8,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_7ba,pLVar2);
      }
      if ((local_7b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_7b8);
      }
      SoftmaxParameter::Clear(this->softmax_param_);
    }
    bVar1 = has_contrastive_loss_param(this);
    if (bVar1) {
      local_7f9 = 0;
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_7f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcf);
        local_7f9 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_7f8,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_7fa,pLVar2);
      }
      if ((local_7f9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_7f8);
      }
      ContrastiveLossParameter::Clear(this->contrastive_loss_param_);
    }
    bVar1 = has_exp_param(this);
    if (bVar1) {
      local_839 = 0;
      if (this->exp_param_ == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_838,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd3);
        local_839 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_838,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_83a,pLVar2);
      }
      if ((local_839 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_838);
      }
      ExpParameter::Clear(this->exp_param_);
    }
    bVar1 = has_loss_param(this);
    if (bVar1) {
      local_879 = 0;
      if (this->loss_param_ == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_878,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd7);
        local_879 = 1;
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_878,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_87a,pLVar2);
      }
      if ((local_879 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_878);
      }
      LossParameter::Clear(this->loss_param_);
    }
  }
  this->type_ = 0;
  local_18 = &this->_has_bits_;
  memset(local_18,0,8);
  this_local = (V1LayerParameter *)&this->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_60 = (InternalMetadataWithArena *)this_local;
    local_10 = (InternalMetadataWithArena *)this_local;
    google::protobuf::internal::InternalMetadataWithArena::DoClear
              ((InternalMetadataWithArena *)this_local);
  }
  return;
}

Assistant:

void V1LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.V1LayerParameter)
  bottom_.Clear();
  top_.Clear();
  blobs_.Clear();
  blobs_lr_.Clear();
  weight_decay_.Clear();
  include_.Clear();
  exclude_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blob_share_mode_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_layer()) {
      GOOGLE_DCHECK(layer_ != NULL);
      layer_->::caffe::V0LayerParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
  }
  type_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}